

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O2

int64_t __thiscall MovParsedSRTTrackData::getSttsVal(MovParsedSRTTrackData *this)

{
  long lVar1;
  ostream *poVar2;
  undefined4 *puVar3;
  MOVStreamContext *pMVar4;
  pointer pMVar5;
  ulong uVar6;
  uint *local_1a8;
  undefined8 local_1a0;
  uint local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ostringstream ss;
  
  uVar6 = this->sttsCnt;
  if (uVar6 == 0) {
    pMVar4 = this->m_sc;
    lVar1 = this->sttsPos + 1;
    this->sttsPos = lVar1;
    pMVar5 = (pMVar4->stts_data).super__Vector_base<MOVStts,_std::allocator<MOVStts>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)((ulong)((long)(pMVar4->stts_data).
                             super__Vector_base<MOVStts,_std::allocator<MOVStts>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar5) >> 4 & 0xffffffff) <=
        lVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar2 = std::operator<<((ostream *)&ss,"MP4/MOV error: invalid stts index for SRT track #");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," at position ");
      std::ostream::_M_insert<long>((long)poVar2);
      puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar3 = 0x3b6;
      *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
      if (local_1a8 == &local_198) {
        puVar3[6] = local_198;
        puVar3[7] = uStack_194;
        puVar3[8] = uStack_190;
        puVar3[9] = uStack_18c;
      }
      else {
        *(uint **)(puVar3 + 2) = local_1a8;
        *(ulong *)(puVar3 + 6) = CONCAT44(uStack_194,local_198);
      }
      *(undefined8 *)(puVar3 + 4) = local_1a0;
      local_198 = local_198 & 0xffffff00;
      __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    uVar6 = (ulong)pMVar5[lVar1].count;
    this->sttsCnt = uVar6;
  }
  else {
    pMVar4 = this->m_sc;
    lVar1 = this->sttsPos;
    pMVar5 = (pMVar4->stts_data).super__Vector_base<MOVStts,_std::allocator<MOVStts>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  this->sttsCnt = uVar6 - 1;
  return (pMVar5[lVar1].duration * 1000) / (long)(ulong)pMVar4->time_scale;
}

Assistant:

int64_t getSttsVal()
    {
        if (sttsCnt == 0)
        {
            sttsPos++;
            if (sttsPos >= static_cast<unsigned>(m_sc->stts_data.size()))
                THROW(ERR_MOV_PARSE, "MP4/MOV error: invalid stts index for SRT track #"
                                         << m_sc->ffindex << " at position " << m_demuxer->getProcessedBytes())

            sttsCnt = m_sc->stts_data[sttsPos].count;
        }
        sttsCnt--;
        return m_sc->stts_data[sttsPos].duration * 1000 / m_sc->time_scale;
    }